

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlcdnumber.cpp
# Opt level: O1

void QLCDNumber::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint *puVar1;
  double *pdVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  double dVar6;
  
  switch(_c);
  switch(_id) {
  case 0:
    QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
    break;
  case 1:
    display((QLCDNumber *)_o,(QString *)_a[1]);
    break;
  case 2:
    display((QLCDNumber *)_o,*_a[1]);
    break;
  case 3:
    dVar6 = *_a[1];
    goto LAB_0041eb42;
  case 4:
    lVar3 = *(long *)(_o + 8);
    *(byte *)(lVar3 + 0x288) = *(byte *)(lVar3 + 0x288) & 0xfc;
    goto LAB_0041eb3a;
  case 5:
    lVar3 = *(long *)(_o + 8);
    bVar4 = (*(byte *)(lVar3 + 0x288) & 0xfc) + 1;
    goto LAB_0041eb34;
  case 6:
    lVar3 = *(long *)(_o + 8);
    bVar4 = *(byte *)(lVar3 + 0x288) & 0xfc | 2;
LAB_0041eb34:
    *(byte *)(lVar3 + 0x288) = bVar4;
    goto LAB_0041eb3a;
  case 7:
    lVar3 = *(long *)(_o + 8);
    *(byte *)(lVar3 + 0x288) = *(byte *)(lVar3 + 0x288) | 3;
LAB_0041eb3a:
    dVar6 = *(double *)(lVar3 + 0x280);
LAB_0041eb42:
    display((QLCDNumber *)_o,dVar6);
    break;
  case 8:
    *(byte *)(*(long *)(_o + 8) + 0x288) = *(byte *)(*(long *)(_o + 8) + 0x288) & 0xfb | *_a[1] << 2
    ;
    QWidget::update((QWidget *)_o);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) {
        return;
      }
      if ((*_a[1] == overflow) && (*(long *)((long)_a[1] + 8) == 0)) {
        *(undefined4 *)*_a = 0;
        return;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) {
          return;
        }
        goto switchD_0041ea9d_caseD_1;
      }
    }
    goto switchD_0041ea9d_caseD_2;
  }
switchD_0041ea9d_caseD_1:
  if (5 < (uint)_id) goto LAB_0041ec4b;
  puVar1 = (uint *)*_a;
  switch(_id) {
  case 0:
    *(byte *)puVar1 = *(byte *)(*(long *)(_o + 8) + 0x288) >> 2 & 1;
    break;
  case 1:
    uVar5 = *(uint *)(*(long *)(_o + 8) + 0x278);
    goto LAB_0041ec49;
  case 2:
    uVar5 = *(byte *)(*(long *)(_o + 8) + 0x288) & 3;
    goto LAB_0041ec49;
  case 3:
    bVar4 = *(byte *)(*(long *)(_o + 8) + 0x288) & 0x18;
    uVar5 = 0;
    if (bVar4 != 0x10) {
      uVar5 = (bVar4 != 0x18) + 1;
    }
    *puVar1 = uVar5;
    break;
  case 4:
    *(undefined8 *)puVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x280);
    break;
  case 5:
    uVar5 = (uint)((double)((ulong)*(double *)(*(long *)(_o + 8) + 0x280) & 0x8000000000000000 |
                           (ulong)DAT_0066f5c0) + *(double *)(*(long *)(_o + 8) + 0x280));
LAB_0041ec49:
    *puVar1 = uVar5;
  }
LAB_0041ec4b:
  if (_c != WriteProperty) {
    return;
  }
switchD_0041ea9d_caseD_2:
  if (5 < (uint)_id) {
    return;
  }
  pdVar2 = (double *)*_a;
  switch(_id) {
  case 0:
    *(byte *)(*(long *)(_o + 8) + 0x288) =
         *(byte *)(*(long *)(_o + 8) + 0x288) & 0xfb | *(byte *)pdVar2 << 2;
    break;
  case 1:
    setDigitCount((QLCDNumber *)_o,*(uint *)pdVar2);
    return;
  case 2:
    lVar3 = *(long *)(_o + 8);
    *(byte *)(lVar3 + 0x288) = *(byte *)(lVar3 + 0x288) & 0xfc | *(byte *)pdVar2 & 3;
    dVar6 = *(double *)(lVar3 + 0x280);
    goto LAB_0041ecba;
  case 3:
    *(byte *)(*(long *)(_o + 8) + 0x288) =
         (*(uint *)pdVar2 < 2) << 4 | (*(uint *)pdVar2 - 1 < 2) << 3 |
         *(byte *)(*(long *)(_o + 8) + 0x288) & 0xe7;
    break;
  case 4:
    dVar6 = *pdVar2;
LAB_0041ecba:
    display((QLCDNumber *)_o,dVar6);
    return;
  case 5:
    display((QLCDNumber *)_o,*(uint *)pdVar2);
    return;
  }
  QWidget::update((QWidget *)_o);
  return;
}

Assistant:

void QLCDNumber::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLCDNumber *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->overflow(); break;
        case 1: _t->display((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->display((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->display((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 4: _t->setHexMode(); break;
        case 5: _t->setDecMode(); break;
        case 6: _t->setOctMode(); break;
        case 7: _t->setBinMode(); break;
        case 8: _t->setSmallDecimalPoint((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLCDNumber::*)()>(_a, &QLCDNumber::overflow, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->smallDecimalPoint(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->digitCount(); break;
        case 2: *reinterpret_cast<Mode*>(_v) = _t->mode(); break;
        case 3: *reinterpret_cast<SegmentStyle*>(_v) = _t->segmentStyle(); break;
        case 4: *reinterpret_cast<double*>(_v) = _t->value(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->intValue(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSmallDecimalPoint(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setDigitCount(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setMode(*reinterpret_cast<Mode*>(_v)); break;
        case 3: _t->setSegmentStyle(*reinterpret_cast<SegmentStyle*>(_v)); break;
        case 4: _t->display(*reinterpret_cast<double*>(_v)); break;
        case 5: _t->display(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}